

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

reference __thiscall
jsoncons::jsonpath::detail::
index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(index_expression_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  type_conflict9 tVar2;
  bool bVar3;
  int iVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  unsigned_long i;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_0000008c;
  value_type j;
  undefined1 local_58 [24];
  string_view_type local_40;
  
  local_58._16_8_ = last;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)local_58,
             (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&this->expr_,(reference)context,root,(result_options)current,
             (error_code *)CONCAT44(in_register_0000008c,options));
  if (ec->_M_value == 0) {
    tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            is_integer<unsigned_long>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58)
    ;
    if ((tVar2) &&
       (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(current),
       bVar3)) {
      i = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
          as_integer<unsigned_long>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(current,i);
      psVar1 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar1 != (supertype *)0x0) {
        iVar4 = (*psVar1->_vptr_jsonpath_selector[3])
                          (psVar1,context,root,local_58._16_8_,pbVar5,options,ec);
        pbVar5 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar4);
      }
      goto LAB_0031d76e;
    }
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58)
    ;
    if ((bVar3) &&
       (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(current)
       , bVar3)) {
      local_40 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                           ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            local_58);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                         (current,&local_40);
      psVar1 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar1 != (supertype *)0x0) {
        iVar4 = (*psVar1->_vptr_jsonpath_selector[3])
                          (psVar1,context,root,local_58._16_8_,pbVar5,options,ec);
        pbVar5 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(extraout_var_00,iVar4);
      }
      goto LAB_0031d76e;
    }
  }
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::null_value(context);
LAB_0031d76e:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58);
  return pbVar5;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            //std::cout << "index_expression_selector current: " << current << "\n";

            value_type j = expr_.evaluate(context, root, current, options, ec);

            if (!ec)
            {
                if (j.template is<std::size_t>() && current.is_array())
                {
                    std::size_t start = j.template as<std::size_t>();
                    return this->evaluate_tail(context, root, last, current.at(start), options, ec);
                }
                if (j.is_string() && current.is_object())
                {
                    return this->evaluate_tail(context, root, last, current.at(j.as_string_view()), options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }